

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lockedpool.cpp
# Opt level: O0

void __thiscall Arena::Arena(Arena *this,void *base_in,size_t size_in,size_t alignment_in)

{
  long lVar1;
  undefined8 in_RCX;
  long in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  pair<std::__detail::_Node_iterator<std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>,_false,_false>,_bool>
  pVar2;
  iterator it;
  unordered_map<void_*,_unsigned_long,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
  *in_stack_ffffffffffffff38;
  void **in_stack_ffffffffffffff40;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  multimap<unsigned_long,_void_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_void_*>_>_>
  *in_stack_ffffffffffffff50;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *in_RDI = &PTR__Arena_00694398;
  std::
  multimap<unsigned_long,_void_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_void_*>_>_>
  ::multimap((multimap<unsigned_long,_void_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_void_*>_>_>
              *)in_stack_ffffffffffffff38);
  std::
  unordered_map<void_*,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>_>_>
  ::unordered_map((unordered_map<void_*,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>_>_>
                   *)in_stack_ffffffffffffff38);
  std::
  unordered_map<void_*,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>_>_>
  ::unordered_map((unordered_map<void_*,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>_>_>
                   *)in_stack_ffffffffffffff38);
  std::
  unordered_map<void_*,_unsigned_long,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
  ::unordered_map(in_stack_ffffffffffffff38);
  in_RDI[0x1c] = in_RSI;
  in_RDI[0x1d] = in_RSI + in_RDX;
  in_RDI[0x1e] = in_RCX;
  std::
  multimap<unsigned_long,void*,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,void*>>>
  ::emplace<unsigned_long&,void*&>
            (in_stack_ffffffffffffff50,
             (unsigned_long *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
             in_stack_ffffffffffffff40);
  pVar2 = std::
          unordered_map<void*,std::_Rb_tree_const_iterator<std::pair<unsigned_long_const,void*>>,std::hash<void*>,std::equal_to<void*>,std::allocator<std::pair<void*const,std::_Rb_tree_const_iterator<std::pair<unsigned_long_const,void*>>>>>
          ::emplace<void*&,std::_Rb_tree_iterator<std::pair<unsigned_long_const,void*>>&>
                    ((unordered_map<void_*,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>_>_>
                      *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58),
                     (void **)in_stack_ffffffffffffff50,
                     (_Rb_tree_iterator<std::pair<const_unsigned_long,_void_*>_> *)
                     CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
  std::
  unordered_map<void*,std::_Rb_tree_const_iterator<std::pair<unsigned_long_const,void*>>,std::hash<void*>,std::equal_to<void*>,std::allocator<std::pair<void*const,std::_Rb_tree_const_iterator<std::pair<unsigned_long_const,void*>>>>>
  ::emplace<char*,std::_Rb_tree_iterator<std::pair<unsigned_long_const,void*>>&>
            ((unordered_map<void_*,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>_>_>
              *)CONCAT17(pVar2.second,in_stack_ffffffffffffff58),(char **)in_stack_ffffffffffffff50,
             (_Rb_tree_iterator<std::pair<const_unsigned_long,_void_*>_> *)
             CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Arena::Arena(void *base_in, size_t size_in, size_t alignment_in):
    base(base_in), end(static_cast<char*>(base_in) + size_in), alignment(alignment_in)
{
    // Start with one free chunk that covers the entire arena
    auto it = size_to_free_chunk.emplace(size_in, base);
    chunks_free.emplace(base, it);
    chunks_free_end.emplace(static_cast<char*>(base) + size_in, it);
}